

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::OneHotEncoder::SerializeWithCachedSizes
          (OneHotEncoder *this,CodedOutputStream *output)

{
  bool bVar1;
  OneHotEncoder_HandleUnknown OVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  OneHotEncoder *this_local;
  
  bVar1 = has_stringcategories(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->CategoryType_).stringcategories_)->super_MessageLite,output);
  }
  bVar1 = has_int64categories(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->CategoryType_).stringcategories_)->super_MessageLite,output);
  }
  bVar1 = outputsparse(this);
  if (bVar1) {
    bVar1 = outputsparse(this);
    google::protobuf::internal::WireFormatLite::WriteBool(10,bVar1,output);
  }
  OVar2 = handleunknown(this);
  if (OVar2 != OneHotEncoder_HandleUnknown_ErrorOnUnknown) {
    OVar2 = handleunknown(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(0xb,OVar2,output);
  }
  return;
}

Assistant:

void OneHotEncoder::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.OneHotEncoder)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.StringVector stringCategories = 1;
  if (has_stringcategories()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *CategoryType_.stringcategories_, output);
  }

  // .CoreML.Specification.Int64Vector int64Categories = 2;
  if (has_int64categories()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *CategoryType_.int64categories_, output);
  }

  // bool outputSparse = 10;
  if (this->outputsparse() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->outputsparse(), output);
  }

  // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
  if (this->handleunknown() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      11, this->handleunknown(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.OneHotEncoder)
}